

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnMemory(SharedValidator *this,Location *loc,Limits *limits)

{
  bool bVar1;
  size_type sVar2;
  MemoryType local_50;
  Enum local_38;
  Enum local_34;
  Enum local_30;
  Enum local_2c;
  Limits *local_28;
  Limits *limits_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  local_28 = limits;
  limits_local = (Limits *)loc;
  loc_local = (Location *)this;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  sVar2 = std::
          vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
          ::size(&this->memories_);
  if (sVar2 != 0) {
    local_2c = (Enum)PrintError(this,(Location *)limits_local,"only one memory block allowed");
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_2c);
  }
  local_30 = (Enum)CheckLimits(this,(Location *)limits_local,local_28,0x10000,"pages");
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_30);
  if ((local_28->is_shared & 1U) != 0) {
    bVar1 = Features::threads_enabled((Features *)this);
    if (bVar1) {
      if ((local_28->has_max & 1U) == 0) {
        local_38 = (Enum)PrintError(this,(Location *)limits_local,
                                    "shared memories must have max sizes");
        Result::operator|=((Result *)((long)&this_local + 4),(Result)local_38);
      }
    }
    else {
      local_34 = (Enum)PrintError(this,(Location *)limits_local,"memories may not be shared");
      Result::operator|=((Result *)((long)&this_local + 4),(Result)local_34);
    }
  }
  MemoryType::MemoryType(&local_50,*local_28);
  std::vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
  ::push_back(&this->memories_,&local_50);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnMemory(const Location& loc, const Limits& limits) {
  Result result = Result::Ok;
  if (memories_.size() > 0) {
    result |= PrintError(loc, "only one memory block allowed");
  }
  result |= CheckLimits(loc, limits, WABT_MAX_PAGES, "pages");

  if (limits.is_shared) {
    if (!options_.features.threads_enabled()) {
      result |= PrintError(loc, "memories may not be shared");
    } else if (!limits.has_max) {
      result |= PrintError(loc, "shared memories must have max sizes");
    }
  }

  memories_.push_back(MemoryType{limits});
  return result;
}